

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O2

void Abc_NtkFraigStoreCheck(Abc_Ntk_t *pFraig)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  uint i;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar6 = pFraig->vPos->nSize;
  iVar2 = Abc_FrameReadStoreSize();
  uVar7 = (long)iVar6 / (long)iVar2;
  if (iVar6 % iVar2 == 0) {
    uVar3 = (uint)uVar7;
    uVar4 = 0;
    if (0 < (int)uVar3) {
      uVar4 = uVar3;
    }
    uVar7 = uVar7 & 0xffffffff;
    i = 0;
    while (i != uVar4) {
      pAVar5 = Abc_NtkPo(pFraig,i);
      pvVar1 = pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
      i = i + 1;
      iVar6 = (int)uVar7;
      for (uVar8 = 2; (int)uVar8 + -1 < iVar2; uVar8 = (ulong)((int)uVar8 + 1)) {
        pAVar5 = Abc_NtkPo(pFraig,(int)uVar7);
        if (pvVar1 != pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]) {
          printf("Verification for PO #%d of network #%d has failed. The PO function is not used.\n"
                 ,(ulong)i,uVar8);
        }
        uVar7 = (ulong)((int)uVar7 + uVar3);
      }
      uVar7 = (ulong)(iVar6 + 1);
    }
    return;
  }
  __assert_fail("nPoFinal % nStored == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFraig.c"
                ,0x31c,"void Abc_NtkFraigStoreCheck(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkFraigStoreCheck( Abc_Ntk_t * pFraig )
{
    Abc_Obj_t * pNode0, * pNode1;
    int nPoOrig, nPoFinal, nStored; 
    int i, k;
    // check that the PO functions are correct
    nPoFinal = Abc_NtkPoNum(pFraig);
    nStored  = Abc_FrameReadStoreSize();
    assert( nPoFinal % nStored == 0 );
    nPoOrig  = nPoFinal / nStored;
    for ( i = 0; i < nPoOrig; i++ )
    {
        pNode0 = Abc_ObjFanin0( Abc_NtkPo(pFraig, i) ); 
        for ( k = 1; k < nStored; k++ )
        {
            pNode1 = Abc_ObjFanin0( Abc_NtkPo(pFraig, k*nPoOrig+i) ); 
            if ( pNode0 != pNode1 )
                printf( "Verification for PO #%d of network #%d has failed. The PO function is not used.\n", i+1, k+1 );
        }
    }
}